

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:191:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:191:17)>
            *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *plVar3;
  RequestHook *pRVar4;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined1 local_120 [56];
  undefined8 local_e8;
  char *local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  OwnPromiseNode local_c8;
  undefined8 local_c0;
  undefined8 local_b0;
  short local_a4;
  undefined4 local_a0;
  undefined8 *local_98;
  long *local_90;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_88;
  Maybe<capnp::MessageSize> local_50;
  PromiseNode *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_88,&((this->f).env)->membraned,&local_50);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
          *)local_120,(int)&local_88,__buf,in_RCX,in_R8D);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcStack_d8 = "operator()";
  local_d0 = 0xc000000c0;
  uVar8 = 0xc000000c0;
  pcVar6 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcVar7 = "operator()";
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
              *)&local_c8,local_120);
  if (local_a4 == 0) {
    local_a0 = 0x7fffffff;
    local_c0 = 0;
    local_b0 = 0;
    local_c8.ptr = (PromiseNode *)0x0;
  }
  local_38 = local_c8.ptr;
  local_30 = local_c0;
  local_28 = local_b0;
  local_20 = local_a0;
  OVar5 = capnp::_::PointerReader::getCapability((PointerReader *)(local_120 + 0x30));
  plVar3 = local_90;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = local_120._48_8_;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = local_e8;
  local_e8 = 0;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_90 != (long *)0x0) {
    local_90 = (long *)0x0;
    (**(code **)*local_98)(local_98,(long)plVar3 + *(long *)(*plVar3 + -0x10),OVar5.ptr);
  }
  uVar2 = local_120._32_8_;
  uVar1 = local_120._24_8_;
  if ((WirePointer *)local_120._24_8_ != (WirePointer *)0x0) {
    local_120._24_8_ = (WirePointer *)0x0;
    local_120._32_4_ = 0;
    local_120._36_2_ = 0;
    local_120._38_2_ = 0;
    (***(_func_int ***)local_120._40_8_)(local_120._40_8_,uVar1,8,uVar2,uVar2,0,pcVar6,pcVar7,uVar8)
    ;
  }
  uVar8 = local_120._16_8_;
  if ((long *)local_120._16_8_ != (long *)0x0) {
    local_120._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_120._8_8_)->_vptr_CapTableReader)
              (local_120._8_8_,uVar8 + *(long *)(*(long *)uVar8 + -0x10));
  }
  uVar8 = local_120._0_8_;
  if ((SegmentBuilder *)local_120._0_8_ != (SegmentBuilder *)0x0) {
    local_120._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar8);
  }
  pRVar4 = local_88.hook.ptr;
  if (local_88.hook.ptr != (RequestHook *)0x0) {
    local_88.hook.ptr = (RequestHook *)0x0;
    (**(local_88.hook.disposer)->_vptr_Disposer)
              (local_88.hook.disposer,
               (_func_int *)((long)&pRVar4->_vptr_RequestHook + (long)pRVar4->_vptr_RequestHook[-2])
              );
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }